

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O0

t_operand __thiscall
xemmai::ast::t_lambda::f_emit(t_lambda *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_scope *ptVar1;
  t_code *ptVar2;
  size_t sVar3;
  size_t sVar4;
  t_targets *ptVar5;
  t_object *this_00;
  t_code *a_code;
  size_type sVar6;
  t_emit *ptVar7;
  reference pptVar8;
  size_type sVar9;
  reference this_01;
  pointer ptVar10;
  t_operand tVar11;
  ulong local_1a8;
  size_t i_2;
  ulong local_190;
  size_t i_1;
  size_t i;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  safe_positions1;
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  *safe_positions0;
  t_targets targets1;
  t_label *return0;
  t_targets *targets0;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> labels1;
  deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *labels0;
  size_t stack0;
  allocator<bool> local_89;
  undefined1 local_88 [8];
  vector<bool,_std::allocator<bool>_> privates1;
  vector<bool,_std::allocator<bool>_> *privates0;
  size_t arguments0;
  t_code *code0;
  t_scope *scope0;
  t_code *code1;
  t_object *code;
  bool a_clear_local;
  bool a_operand_local;
  bool a_tail_local;
  t_emit *a_emit_local;
  t_lambda *this_local;
  anon_union_8_4_0f1077ea_for_t_operand_2 local_10;
  
  this_00 = f_code(this,a_emit->v_module);
  a_code = t_object::f_as<xemmai::t_code>(this_00);
  ptVar1 = a_emit->v_scope;
  a_emit->v_scope = &this->super_t_scope;
  ptVar2 = a_emit->v_code;
  a_emit->v_code = a_code;
  sVar3 = a_emit->v_arguments;
  a_emit->v_arguments = this->v_arguments;
  privates1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)a_emit->v_privates;
  sVar6 = std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          size(&(this->super_t_scope).v_privates);
  sVar4 = this->v_arguments;
  std::allocator<bool>::allocator(&local_89);
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_88,sVar6 - sVar4,&local_89);
  std::allocator<bool>::~allocator(&local_89);
  a_emit->v_privates = (vector<bool,_std::allocator<bool>_> *)local_88;
  sVar4 = a_emit->v_stack;
  sVar6 = std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          size(&(this->super_t_scope).v_privates);
  a_emit->v_stack = sVar6;
  labels1.super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)a_emit->v_labels;
  std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::deque
            ((deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)&targets0);
  a_emit->v_labels =
       (deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)&targets0;
  ptVar5 = a_emit->v_targets;
  targets1.v_continue_junction = (t_block *)t_emit::f_label(a_emit);
  safe_positions0 =
       (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        *)0x0;
  targets1.v_break = (t_label *)0x0;
  targets1.v_break_junction = (t_block *)a_emit->v_stack;
  targets1.v_break_stack._0_1_ = 0;
  targets1.v_break_stack._1_1_ = 0;
  targets1.v_break_is_tail = false;
  targets1.v_break_must_clear = false;
  targets1._26_6_ = 0;
  targets1.v_continue = (t_label *)0x0;
  targets1.v_return = (t_label *)&(this->super_t_scope).v_junction;
  targets1.v_return_junction = (t_block *)a_emit->v_stack;
  targets1.v_return_stack._0_1_ = 1;
  a_emit->v_targets = (t_targets *)&safe_positions0;
  safe_positions1.
  super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)a_emit->v_safe_positions;
  targets1._72_8_ = targets1.v_continue_junction;
  std::
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ::vector((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
            *)&i);
  a_emit->v_safe_positions =
       (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        *)&i;
  if (((this->super_t_scope).v_self_shared & 1U) != 0) {
    ptVar7 = t_emit::operator<<(a_emit,c_instruction__SELF);
    ptVar7 = t_emit::operator<<(ptVar7,a_emit->v_stack);
    ptVar7 = t_emit::operator<<(ptVar7,c_instruction__SCOPE_PUT0);
    ptVar7 = t_emit::operator<<(ptVar7,a_emit->v_stack);
    t_emit::operator<<(ptVar7,0);
  }
  for (i_1 = 0; i_1 < this->v_arguments; i_1 = i_1 + 1) {
    pptVar8 = std::
              vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
              operator[](&(this->super_t_scope).v_privates,i_1);
    if (((*pptVar8)->v_shared & 1U) != 0) {
      ptVar7 = t_emit::operator<<(a_emit,c_instruction__STACK_GET);
      ptVar7 = t_emit::operator<<(ptVar7,a_emit->v_stack);
      ptVar7 = t_emit::operator<<(ptVar7,i_1);
      ptVar7 = t_emit::operator<<(ptVar7,c_instruction__SCOPE_PUT0);
      ptVar7 = t_emit::operator<<(ptVar7,a_emit->v_stack);
      pptVar8 = std::
                vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>
                ::operator[](&(this->super_t_scope).v_privates,i_1);
      t_emit::operator<<(ptVar7,(*pptVar8)->v_index);
    }
  }
  anon_unknown_11::f_emit_block(a_emit,&(this->super_t_scope).v_block,true,false,false);
  t_emit::f_pop(a_emit);
  t_emit::f_target(a_emit,(t_label *)targets1._72_8_);
  sVar6 = a_emit->v_stack;
  sVar9 = std::vector<xemmai::t_code::t_variable_*,_std::allocator<xemmai::t_code::t_variable_*>_>::
          size(&(this->super_t_scope).v_privates);
  if (sVar6 != sVar9) {
    __assert_fail("a_emit.v_stack == v_privates.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/shin1m[P]xemmai/src/ast.cc"
                  ,0xa9,
                  "virtual t_operand xemmai::ast::t_lambda::f_emit(t_emit &, bool, bool, bool)");
  }
  t_emit::operator<<(a_emit,c_instruction__RETURN_T);
  t_emit::f_resolve(a_emit);
  a_emit->v_scope = ptVar1;
  a_emit->v_code = ptVar2;
  a_emit->v_arguments = sVar3;
  a_emit->v_privates =
       (vector<bool,_std::allocator<bool>_> *)
       privates1.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
       _M_end_of_storage;
  a_emit->v_stack = sVar4;
  a_emit->v_labels =
       (deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)
       labels1.super__Deque_base<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>.
       _M_impl.super__Deque_impl_data._M_finish._M_node;
  a_emit->v_targets = ptVar5;
  a_emit->v_safe_positions =
       (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
        *)safe_positions1.
          super__Vector_base<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  if (a_emit->v_safe_points !=
      (map<std::pair<unsigned_long,_void_**>,_unsigned_long,_std::less<std::pair<unsigned_long,_void_**>_>,_std::allocator<std::pair<const_std::pair<unsigned_long,_void_**>,_unsigned_long>_>_>
       *)0x0) {
    f_safe_points(this,a_code,a_emit->v_safe_points,
                  (vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
                   *)&i);
  }
  t_emit::f_emit_safe_point(a_emit,&this->super_t_node);
  if ((this->v_variadic & 1U) == 0) {
    sVar6 = std::
            vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ::size(&this->v_defaults);
    if (sVar6 == 0) {
      t_emit::operator<<(a_emit,c_instruction__LAMBDA);
      goto LAB_001abf9f;
    }
  }
  local_190 = 0;
  while( true ) {
    sVar6 = std::
            vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ::size(&this->v_defaults);
    if (sVar6 <= local_190) break;
    this_01 = std::
              vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
              ::operator[](&this->v_defaults,local_190);
    ptVar10 = std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>::
              operator->(this_01);
    (*ptVar10->_vptr_t_node[3])(ptVar10,a_emit,0,0);
    local_190 = local_190 + 1;
  }
  local_1a8 = 0;
  while( true ) {
    sVar6 = std::
            vector<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
            ::size(&this->v_defaults);
    if (sVar6 <= local_1a8) break;
    t_emit::f_pop(a_emit);
    local_1a8 = local_1a8 + 1;
  }
  t_emit::operator<<(a_emit,c_instruction__ADVANCED_LAMBDA);
LAB_001abf9f:
  ptVar7 = t_emit::operator<<(a_emit,a_emit->v_stack);
  ptVar7 = t_emit::operator<<(ptVar7,this_00);
  t_emit::f_push(ptVar7);
  if (a_clear) {
    t_emit::f_pop(a_emit);
  }
  t_operand::t_operand((t_operand *)&this_local);
  std::
  vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
  ::~vector((vector<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>,_std::allocator<std::tuple<unsigned_long,_unsigned_long,_unsigned_long>_>_>
             *)&i);
  std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::~deque
            ((deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_> *)&targets0);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_88)
  ;
  tVar11._4_4_ = 0;
  tVar11.v_tag = (uint)this_local;
  tVar11.field_1.v_integer = local_10.v_integer;
  return tVar11;
}

Assistant:

t_operand t_lambda::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	auto code = f_code(a_emit.v_module);
	auto& code1 = code->f_as<t_code>();
	auto scope0 = a_emit.v_scope;
	a_emit.v_scope = this;
	auto code0 = a_emit.v_code;
	a_emit.v_code = &code1;
	auto arguments0 = a_emit.v_arguments;
	a_emit.v_arguments = v_arguments;
	auto privates0 = a_emit.v_privates;
	std::vector<bool> privates1(v_privates.size() - v_arguments);
	a_emit.v_privates = &privates1;
	auto stack0 = a_emit.v_stack;
	a_emit.v_stack = v_privates.size();
	auto labels0 = a_emit.v_labels;
	std::deque<t_emit::t_label> labels1;
	a_emit.v_labels = &labels1;
	auto targets0 = a_emit.v_targets;
	auto& return0 = a_emit.f_label();
	t_emit::t_targets targets1{nullptr, nullptr, a_emit.v_stack, false, false, nullptr, nullptr, &return0, &v_junction, a_emit.v_stack, true};
	a_emit.v_targets = &targets1;
	auto safe_positions0 = a_emit.v_safe_positions;
	std::vector<std::tuple<size_t, size_t, size_t>> safe_positions1;
	a_emit.v_safe_positions = &safe_positions1;
	if (v_self_shared) a_emit
		<< c_instruction__SELF << a_emit.v_stack
		<< c_instruction__SCOPE_PUT0 << a_emit.v_stack << 0;
	for (size_t i = 0; i < v_arguments; ++i)
		if (v_privates[i]->v_shared) a_emit
			<< c_instruction__STACK_GET << a_emit.v_stack << i
			<< c_instruction__SCOPE_PUT0 << a_emit.v_stack << v_privates[i]->v_index;
	f_emit_block(a_emit, v_block, true, false);
	a_emit.f_pop();
	a_emit.f_target(return0);
	assert(a_emit.v_stack == v_privates.size());
	a_emit << c_instruction__RETURN_T;
	a_emit.f_resolve();
	a_emit.v_scope = scope0;
	a_emit.v_code = code0;
	a_emit.v_arguments = arguments0;
	a_emit.v_privates = privates0;
	a_emit.v_stack = stack0;
	a_emit.v_labels = labels0;
	a_emit.v_targets = targets0;
	a_emit.v_safe_positions = safe_positions0;
	if (a_emit.v_safe_points) f_safe_points(code1, *a_emit.v_safe_points, safe_positions1);
	a_emit.f_emit_safe_point(this);
	if (v_variadic || v_defaults.size() > 0) {
		for (size_t i = 0; i < v_defaults.size(); ++i) v_defaults[i]->f_emit(a_emit, false, false);
		for (size_t i = 0; i < v_defaults.size(); ++i) a_emit.f_pop();
		a_emit << c_instruction__ADVANCED_LAMBDA;
	} else {
		a_emit << c_instruction__LAMBDA;
	}
	(a_emit << a_emit.v_stack << code).f_push();
	if (a_clear) a_emit.f_pop();
	return {};
}